

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

void moira::sprintd(char **s,u64 value)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  
  if (value == 0) {
    uVar2 = 1;
  }
  else {
    dVar3 = log10((double)(long)value);
    uVar1 = (int)dVar3 + 1;
    uVar2 = (ulong)uVar1;
    if ((int)dVar3 < 0) goto LAB_0012f205;
  }
  uVar1 = (uint)uVar2;
  uVar2 = uVar2 + 1;
  do {
    (*s)[uVar2 - 2] = (char)value + (char)(value / 10) * -10 | 0x30;
    uVar2 = uVar2 - 1;
    value = value / 10;
  } while (1 < uVar2);
LAB_0012f205:
  *s = *s + (int)uVar1;
  return;
}

Assistant:

static void sprintd(char *&s, u64 value)
{
    sprintd(s, value, decDigits(value));
}